

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

bool deqp::gls::StateQueryUtil::checkError(ResultCollector *result,CallLogWrapper *gl,char *msg)

{
  char *__s;
  CallLogWrapper *this;
  bool bVar1;
  Enum<int,_2UL> EVar2;
  GetNameFunc local_d8;
  int local_d0;
  string local_c8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  GLenum local_2c;
  char *pcStack_28;
  GLenum errorCode;
  char *msg_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  pcStack_28 = msg;
  msg_local = (char *)gl;
  gl_local = (CallLogWrapper *)result;
  local_2c = glu::CallLogWrapper::glGetError(gl);
  this = gl_local;
  __s = pcStack_28;
  bVar1 = local_2c != 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_91);
    std::operator+(&local_70,&local_90,": glGetError() returned ");
    EVar2 = glu::getErrorStr(local_2c);
    local_d8 = EVar2.m_getName;
    local_d0 = EVar2.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_d8);
    std::operator+(&local_50,&local_70,&local_c8);
    tcu::ResultCollector::fail((ResultCollector *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  result_local._7_1_ = !bVar1;
  return result_local._7_1_;
}

Assistant:

static bool checkError (tcu::ResultCollector& result, glu::CallLogWrapper& gl, const char* msg)
{
	const glw::GLenum errorCode = gl.glGetError();

	if (errorCode == GL_NO_ERROR)
		return true;

	result.fail(std::string(msg) + ": glGetError() returned " + glu::getErrorStr(errorCode).toString());
	return false;
}